

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate-vfp.inc.c
# Opt level: O3

_Bool do_vfp_2op_sp(DisasContext_conflict1 *s,VFPGen2OpSPFn_conflict *fn,int vd,int vm)

{
  TCGContext_conflict1 *s_00;
  uint uVar1;
  _Bool _Var2;
  TCGTemp *a1;
  TCGTemp *a1_00;
  uint uVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  bool bVar7;
  
  uVar3 = s->isar->mvfr0;
  if ((uVar3 & 0xf0) == 0) {
    return false;
  }
  s_00 = s->uc->tcg_ctx;
  iVar4 = s->vec_len;
  if ((uVar3 & 0xf000000) == 0) {
    if (iVar4 != 0) {
      return false;
    }
    if (s->vec_stride != 0) {
      return false;
    }
    _Var2 = full_vfp_access_check(s,false);
    uVar3 = 0;
    iVar4 = 0;
    uVar1 = 0;
    if (!_Var2) {
      return true;
    }
  }
  else {
    _Var2 = full_vfp_access_check(s,false);
    if (!_Var2) {
      return true;
    }
    if (iVar4 < 1) {
      uVar3 = 0;
      uVar1 = 0;
    }
    else if ((vd & 0x18U) == 0) {
      uVar3 = 0;
      iVar4 = 0;
      uVar1 = 0;
    }
    else {
      uVar3 = s->vec_stride + 1;
      uVar1 = vm & 0x18U;
      if ((vm & 0x18U) != 0) {
        uVar1 = uVar3;
      }
    }
  }
  a1 = tcg_temp_new_internal_aarch64(s_00,TCG_TYPE_I32,false);
  a1_00 = tcg_temp_new_internal_aarch64(s_00,TCG_TYPE_I32,false);
  tcg_gen_op3_aarch64(s_00,INDEX_op_ld_i32,(TCGArg)a1,(TCGArg)(s_00->cpu_env + (long)s_00),
                      (ulong)(vm * 4 & 4) + ((ulong)(vm * 4 & 8) | (ulong)((uint)vm >> 2) << 8) +
                      0xc10);
  uVar6 = vd;
  iVar5 = iVar4;
  while( true ) {
    (*fn)(s_00,(TCGv_i32)((long)a1_00 - (long)s_00),(TCGv_i32)((long)a1 - (long)s_00));
    tcg_gen_op3_aarch64(s_00,INDEX_op_st_i32,(TCGArg)a1_00,(TCGArg)(s_00->cpu_env + (long)s_00),
                        (ulong)(uVar6 * 4 & 4) + ((ulong)(uVar6 * 4 & 8) | (ulong)(uVar6 >> 2) << 8)
                        + 0xc10);
    bVar7 = iVar5 == 0;
    iVar5 = iVar5 + -1;
    if (bVar7) break;
    if (uVar1 == 0) goto LAB_00661d99;
    uVar6 = uVar6 & 0xfffffff8 | uVar3 + uVar6 & 7;
    vm = vm & 0xfffffff8U | vm + uVar1 & 7;
    tcg_gen_op3_aarch64(s_00,INDEX_op_ld_i32,(TCGArg)a1,(TCGArg)(s_00->cpu_env + (long)s_00),
                        (ulong)(vm * 4 & 4) + ((ulong)(vm * 4 & 8) | (ulong)((uint)vm >> 2) << 8) +
                        0xc10);
  }
LAB_00661df0:
  tcg_temp_free_internal_aarch64(s_00,(TCGTemp *)((TCGv_i32)((long)a1 - (long)s_00) + (long)s_00));
  tcg_temp_free_internal_aarch64
            (s_00,(TCGTemp *)((TCGv_i32)((long)a1_00 - (long)s_00) + (long)s_00));
  return true;
LAB_00661d99:
  do {
    vd = vd & 0xfffffff8U | uVar3 + vd & 7;
    tcg_gen_op3_aarch64(s_00,INDEX_op_st_i32,(TCGArg)a1_00,(TCGArg)(s_00->cpu_env + (long)s_00),
                        (ulong)(vd * 4 & 4) + ((ulong)(vd * 4 & 8) | (ulong)((uint)vd >> 2) << 8) +
                        0xc10);
    iVar4 = iVar4 + -1;
  } while (iVar4 != 0);
  goto LAB_00661df0;
}

Assistant:

static bool do_vfp_2op_sp(DisasContext *s, VFPGen2OpSPFn *fn, int vd, int vm)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    uint32_t delta_m = 0;
    uint32_t delta_d = 0;
    int veclen = s->vec_len;
    TCGv_i32 f0, fd;

    if (!dc_isar_feature(aa32_fpsp_v2, s)) {
        return false;
    }

    if (!dc_isar_feature(aa32_fpshvec, s) &&
        (veclen != 0 || s->vec_stride != 0)) {
        return false;
    }

    if (!vfp_access_check(s)) {
        return true;
    }

    if (veclen > 0) {
        /* Figure out what type of vector operation this is.  */
        if (vfp_sreg_is_scalar(vd)) {
            /* scalar */
            veclen = 0;
        } else {
            delta_d = s->vec_stride + 1;

            if (vfp_sreg_is_scalar(vm)) {
                /* mixed scalar/vector */
                delta_m = 0;
            } else {
                /* vector */
                delta_m = delta_d;
            }
        }
    }

    f0 = tcg_temp_new_i32(tcg_ctx);
    fd = tcg_temp_new_i32(tcg_ctx);

    neon_load_reg32(tcg_ctx, f0, vm);

    for (;;) {
        fn(tcg_ctx, fd, f0);
        neon_store_reg32(tcg_ctx, fd, vd);

        if (veclen == 0) {
            break;
        }

        if (delta_m == 0) {
            /* single source one-many */
            while (veclen--) {
                vd = vfp_advance_sreg(vd, delta_d);
                neon_store_reg32(tcg_ctx, fd, vd);
            }
            break;
        }

        /* Set up the operands for the next iteration */
        veclen--;
        vd = vfp_advance_sreg(vd, delta_d);
        vm = vfp_advance_sreg(vm, delta_m);
        neon_load_reg32(tcg_ctx, f0, vm);
    }

    tcg_temp_free_i32(tcg_ctx, f0);
    tcg_temp_free_i32(tcg_ctx, fd);

    return true;
}